

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O0

void __thiscall Trainer::Trainer<Kuhn::Game>::train(Trainer<Kuhn::Game> *this,int iterations)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Game *pGVar2;
  Node *pNVar3;
  ulong uVar4;
  long lVar5;
  Trainer<Kuhn::Game> *pTVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
  *puVar10;
  reference ppVar11;
  __tuple_element_t<0UL,_tuple<double,_double>_> *p_Var12;
  ostream *poVar13;
  size_type sVar14;
  double dVar15;
  undefined8 uStack_c0;
  undefined1 auStack_b8 [12];
  int local_ac;
  ostream *local_a8;
  int local_9c;
  Trainer<Kuhn::Game> *local_98;
  undefined1 *local_90;
  int local_84;
  undefined1 local_80 [4];
  int p_1;
  reference local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>
  *itr_1;
  iterator __end6;
  iterator __begin6;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
  *__range6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>
  *itr;
  iterator __end5;
  iterator __begin5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
  *__range5;
  int p;
  int i;
  unsigned_long __vla_expr0;
  int iterations_local;
  Trainer<Kuhn::Game> *this_local;
  
  uStack_c0 = 0x10e482;
  local_98 = this;
  uVar8 = Kuhn::Game::playerNum();
  lVar5 = -((ulong)uVar8 * 8 + 0xf & 0xfffffffffffffff0);
  local_90 = auStack_b8 + lVar5;
  __range5._4_4_ = 0;
  do {
    pTVar6 = local_98;
    if (iterations <= __range5._4_4_) {
      *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e8f0;
      writeStrategyToBin(pTVar6,-1);
      return;
    }
    __range5._0_4_ = 0;
    while( true ) {
      local_9c = (int)__range5;
      *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e4d3;
      iVar9 = Kuhn::Game::playerNum();
      if (iVar9 <= local_9c) break;
      if ((local_98->mUpdate[(int)__range5] & 1U) != 0) {
        pbVar1 = local_98->mModeStr;
        *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e51a;
        bVar7 = std::operator==(pbVar1,"vanilla");
        if (bVar7) {
          pGVar2 = local_98->mGame;
          *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e538;
          Kuhn::Game::reset(pGVar2,false);
          pTVar6 = local_98;
          pGVar2 = local_98->mGame;
          *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e559;
          dVar15 = CFR(pTVar6,pGVar2,(int)__range5,1.0,1.0);
          *(double *)(local_90 + (long)(int)__range5 * 8) = dVar15;
          puVar10 = &local_98->mNodeMap;
          *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e583;
          __end5 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                   ::begin(puVar10);
          *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e590;
          itr = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>
                 *)std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                   ::end(puVar10);
          while( true ) {
            *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e5a1;
            bVar7 = std::__detail::operator!=
                              (&__end5.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
                               ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
                                 *)&itr);
            if (!bVar7) break;
            *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e5b0;
            ppVar11 = std::__detail::
                      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_false,_true>
                      ::operator*(&__end5);
            pNVar3 = ppVar11->second;
            *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e5c1;
            Node::updateStrategy(pNVar3);
            *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e5ca;
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_false,_true>
            ::operator++(&__end5);
          }
        }
        else {
          pGVar2 = local_98->mGame;
          *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e5e9;
          Kuhn::Game::reset(pGVar2,true);
          pbVar1 = local_98->mModeStr;
          *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e603;
          bVar7 = std::operator==(pbVar1,"chance");
          pTVar6 = local_98;
          if (bVar7) {
            pGVar2 = local_98->mGame;
            *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e62d;
            dVar15 = chanceSamplingCFR(pTVar6,pGVar2,(int)__range5,1.0,1.0);
            *(double *)(local_90 + (long)(int)__range5 * 8) = dVar15;
            puVar10 = &local_98->mNodeMap;
            *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e657;
            __end6 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                     ::begin(puVar10);
            *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e664;
            itr_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>
                     *)std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                       ::end(puVar10);
            while( true ) {
              *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e675;
              bVar7 = std::__detail::operator!=
                                (&__end6.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
                                 ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
                                   *)&itr_1);
              if (!bVar7) break;
              *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e684;
              local_70 = std::__detail::
                         _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_false,_true>
                         ::operator*(&__end6);
              pNVar3 = local_70->second;
              *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e695;
              Node::updateStrategy(pNVar3);
              *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e69e;
              std::__detail::
              _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_false,_true>
              ::operator++(&__end6);
            }
          }
          else {
            pbVar1 = local_98->mModeStr;
            *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e6bf;
            bVar7 = std::operator==(pbVar1,"external");
            pTVar6 = local_98;
            if (bVar7) {
              pGVar2 = local_98->mGame;
              *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e6db;
              dVar15 = externalSamplingCFR(pTVar6,pGVar2,(int)__range5);
              *(double *)(local_90 + (long)(int)__range5 * 8) = dVar15;
            }
            else {
              pbVar1 = local_98->mModeStr;
              *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e70a;
              bVar7 = std::operator==(pbVar1,"outcome");
              pTVar6 = local_98;
              if (!bVar7) {
                *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e77d;
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_c_cmakelists/bakanaouji[P]cpp-cfr/RegretMinimization/Trainer/Trainer.cpp"
                              ,0x127,
                              "void Trainer::Trainer<Kuhn::Game>::train(const int) [T = Kuhn::Game]"
                             );
              }
              pGVar2 = local_98->mGame;
              *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e73c;
              outcomeSamplingCFR((Trainer<Kuhn::Game> *)local_80,(Game *)pTVar6,(int)pGVar2,
                                 (int)__range5,1.0,1.0,1.0);
              *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e745;
              p_Var12 = std::get<0ul,double,double>((tuple<double,_double> *)local_80);
              *(__tuple_element_t<0UL,_tuple<double,_double>_> *)
               (local_90 + (long)(int)__range5 * 8) = *p_Var12;
            }
          }
        }
      }
      __range5._0_4_ = (int)__range5 + 1;
    }
    if (__range5._4_4_ % 1000 == 0) {
      *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e7ba;
      poVar13 = std::operator<<((ostream *)&std::cout,"iteration:");
      *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e7c5;
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,__range5._4_4_);
      *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e7d4;
      poVar13 = std::operator<<(poVar13,", cumulative nodes touched: ");
      uVar4 = local_98->mNodeTouchedCnt;
      *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e7ea;
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar4);
      *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e7f9;
      local_a8 = std::operator<<(poVar13,", infosets num: ");
      puVar10 = &local_98->mNodeMap;
      *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e813;
      sVar14 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
               ::size(puVar10);
      poVar13 = local_a8;
      *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e822;
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,sVar14);
      *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e831;
      std::operator<<(poVar13,", expected payoffs: (");
      local_84 = 0;
      while( true ) {
        local_ac = local_84;
        *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e846;
        iVar9 = Kuhn::Game::playerNum();
        if (iVar9 <= local_ac) break;
        dVar15 = *(double *)(local_90 + (long)local_84 * 8);
        *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e86e;
        poVar13 = (ostream *)std::ostream::operator<<(&std::cout,dVar15);
        *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e87d;
        std::operator<<(poVar13,",");
        local_84 = local_84 + 1;
      }
      *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e89b;
      poVar13 = std::operator<<((ostream *)&std::cout,")");
      *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e8aa;
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    }
    pTVar6 = local_98;
    if ((__range5._4_4_ != 0) && (__range5._4_4_ % 10000000 == 0)) {
      *(undefined8 *)(auStack_b8 + lVar5 + -8) = 0x10e8cf;
      writeStrategyToBin(pTVar6,__range5._4_4_);
    }
    __range5._4_4_ = __range5._4_4_ + 1;
  } while( true );
}

Assistant:

void Trainer<T>::train(const int iterations) {
    double utils[mGame->playerNum()];

    for (int i = 0; i < iterations; ++i) {
        for (int p = 0; p < mGame->playerNum(); ++p) {
            if (!mUpdate[p]) {
                continue;
            }
            if (mModeStr == "vanilla") {
                mGame->reset(false);
                utils[p] = CFR(*mGame, p, 1.0, 1.0);
                for (auto & itr : mNodeMap) {
                    itr.second->updateStrategy();
                }
            } else {
                mGame->reset();
                if (mModeStr == "chance") {
                    utils[p] = chanceSamplingCFR(*mGame, p, 1.0, 1.0);
                    for (auto & itr : mNodeMap) {
                        itr.second->updateStrategy();
                    }
                } else if (mModeStr == "external") {
                    utils[p] = externalSamplingCFR(*mGame, p);
                } else if (mModeStr == "outcome") {
                    utils[p] = std::get<0>(outcomeSamplingCFR(*mGame, p, i, 1.0, 1.0, 1.0));
                } else {
                    assert(false);
                }
            }
        }
        if (i % 1000 == 0) {
            std::cout << "iteration:" << i << ", cumulative nodes touched: " << mNodeTouchedCnt << ", infosets num: " << mNodeMap.size() << ", expected payoffs: (";
            for (int p = 0; p < mGame->playerNum(); ++p) {
                std::cout << utils[p] << ",";
            }
            std::cout << ")" << std::endl;
        }
        if (i != 0 && i % 10000000 == 0) {
            writeStrategyToBin(i);
        }
    }

    writeStrategyToBin();
}